

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

AnyCellmlElementPtr __thiscall
libcellml::Annotator::AnnotatorImpl::convertToWeak(AnnotatorImpl *this,AnyCellmlElementPtr *item)

{
  _Atomic_word *p_Var1;
  CellmlElementType CVar2;
  int iVar3;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  AnyCellmlElementPtr AVar5;
  ResetWeakPtr weakReset;
  shared_ptr<libcellml::UnitsItem> local_38;
  weak_ptr<libcellml::Component> local_28;
  
  AnyCellmlElement::AnyCellmlElementImpl::create();
  CVar2 = AnyCellmlElement::type((AnyCellmlElement *)*in_RDX);
  *(CellmlElementType *)
   *(this->super_LoggerImpl).mErrors.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = CVar2;
  CVar2 = AnyCellmlElement::type((AnyCellmlElement *)*in_RDX);
  switch(CVar2) {
  case COMPONENT:
  case COMPONENT_REF:
    AnyCellmlElement::component((AnyCellmlElement *)&local_38);
    local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
        if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        goto LAB_001d066b;
      }
      else {
        (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
LAB_001d066b:
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),&local_28);
    _Var4._M_pi = extraout_RDX_03;
    break;
  case CONNECTION:
  case MAP_VARIABLES:
    AnyCellmlElement::variablePair((AnyCellmlElement *)&local_38);
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (shared_ptr<libcellml::VariablePair> *)&local_38);
    _Var4._M_pi = extraout_RDX;
    goto LAB_001d0557;
  case ENCAPSULATION:
  case MODEL:
    AnyCellmlElement::model((AnyCellmlElement *)&local_38);
    local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
        if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        goto LAB_001d0697;
      }
      else {
        (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
LAB_001d0697:
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (weak_ptr<libcellml::Model> *)&local_28);
    _Var4._M_pi = extraout_RDX_04;
    break;
  case IMPORT:
    AnyCellmlElement::importSource((AnyCellmlElement *)&local_38);
    local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
        if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        goto LAB_001d06e9;
      }
      else {
        (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
LAB_001d06e9:
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (weak_ptr<libcellml::ImportSource> *)&local_28);
    _Var4._M_pi = extraout_RDX_06;
    break;
  default:
    AnyCellmlElement::variable((AnyCellmlElement *)&local_38);
    local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
        if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        goto LAB_001d0712;
      }
      else {
        (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
LAB_001d0712:
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (weak_ptr<libcellml::Variable> *)&local_28);
    _Var4._M_pi = extraout_RDX_07;
    break;
  case RESET:
  case RESET_VALUE:
  case TEST_VALUE:
    AnyCellmlElement::reset((AnyCellmlElement *)&local_38);
    local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
        if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        goto LAB_001d063f;
      }
      else {
        (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
LAB_001d063f:
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (weak_ptr<libcellml::Reset> *)&local_28);
    _Var4._M_pi = extraout_RDX_02;
    break;
  case UNIT:
    AnyCellmlElement::unitsItem((AnyCellmlElement *)&local_38);
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),&local_38);
    _Var4._M_pi = extraout_RDX_00;
LAB_001d0557:
    if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var4._M_pi = extraout_RDX_01;
    }
    goto LAB_001d075c;
  case UNITS:
    AnyCellmlElement::units((AnyCellmlElement *)&local_38);
    local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
        if (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        goto LAB_001d06c0;
      }
      else {
        (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
LAB_001d06c0:
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (weak_ptr<libcellml::Units> *)&local_28);
    _Var4._M_pi = extraout_RDX_05;
  }
  if (local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(local_28.super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
      _Var4._M_pi = extraout_RDX_08;
    }
  }
LAB_001d075c:
  AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnyCellmlElementPtr)
         AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Annotator::AnnotatorImpl::convertToWeak(const AnyCellmlElementPtr &item)
{
    auto converted = AnyCellmlElement::AnyCellmlElementImpl::create();
    auto type = item->type();

    converted->mPimpl->mType = type;

    switch (item->type()) {
    case CellmlElementType::COMPONENT:
    case CellmlElementType::COMPONENT_REF: {
        ComponentWeakPtr weakComponent = item->component();
        converted->mPimpl->mItem = weakComponent;
    } break;
    case CellmlElementType::CONNECTION:
    case CellmlElementType::MAP_VARIABLES:
        // We don't store a weak pointer for connections / map variables because
        // the map is the owner of the VariablePair object.
        converted->mPimpl->mItem = item->variablePair();
        break;
    case CellmlElementType::ENCAPSULATION:
    case CellmlElementType::MODEL: {
        ModelWeakPtr weakModel = item->model();
        converted->mPimpl->mItem = weakModel;
    } break;
    case CellmlElementType::IMPORT: {
        ImportSourceWeakPtr weakImportSource = item->importSource();
        converted->mPimpl->mItem = weakImportSource;
    } break;
    case CellmlElementType::RESET:
    case CellmlElementType::RESET_VALUE:
    case CellmlElementType::TEST_VALUE: {
        ResetWeakPtr weakReset = item->reset();
        converted->mPimpl->mItem = weakReset;
    } break;
    case CellmlElementType::UNIT:
        // We don't store a weak pointer for units item because the map is the
        // owner of the UnitsItem object.
        converted->mPimpl->mItem = item->unitsItem();
        break;
    case CellmlElementType::UNITS: {
        UnitsWeakPtr weakUnits = item->units();
        converted->mPimpl->mItem = weakUnits;
    } break;
    default: { /* CellmlElementType::VARIABLE */
        VariableWeakPtr weakVariable = item->variable();
        converted->mPimpl->mItem = weakVariable;
    } break;
    }

    return converted;
}